

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringMaker<char[12],void> * __thiscall
Catch::StringMaker<char[12],void>::convert_abi_cxx11_(StringMaker<char[12],void> *this,char *str)

{
  allocator local_39;
  string local_38 [32];
  char *local_18;
  char *str_local;
  
  local_18 = str;
  str_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,str,&local_39);
  Detail::stringify<std::__cxx11::string>
            ((Detail *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return this;
}

Assistant:

static std::string convert(char const* str) {
            return ::Catch::Detail::stringify(std::string{ str });
        }